

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O3

void __thiscall rtosc::AutomationMgr::setparameternumber(AutomationMgr *this,uint type,int value)

{
  long lVar1;
  
  if ((int)type < 0x62) {
    if (type == 6) {
      if ((this->NRPN).parhi < 0) {
        return;
      }
      lVar1 = 0x5c;
    }
    else {
      if (type != 0x26) {
        return;
      }
      if ((this->NRPN).parhi < 0) {
        return;
      }
      lVar1 = 0x60;
    }
    if ((this->NRPN).parlo < 0) {
      return;
    }
  }
  else {
    if (type == 99) {
      lVar1 = 0x54;
    }
    else {
      if (type != 0x62) {
        return;
      }
      lVar1 = 0x58;
    }
    *(int *)((long)&this->slots + lVar1) = value;
    (this->NRPN).valhi = -1;
    value = -1;
    lVar1 = 0x60;
  }
  *(int *)((long)&this->slots + lVar1) = value;
  return;
}

Assistant:

void AutomationMgr::setparameternumber(unsigned int type, int value)
{
    switch(type) {
        case C_nrpnhi:
            NRPN.parhi = value;
            NRPN.valhi = -1;
            NRPN.vallo = -1; //clear the values
            break;
        case C_nrpnlo:
            NRPN.parlo = value;
            NRPN.valhi = -1;
            NRPN.vallo = -1; //clear the values
            break;
        case C_dataentryhi:
            if((NRPN.parhi >= 0) && (NRPN.parlo >= 0))
                NRPN.valhi = value;
            break;
        case C_dataentrylo:
            if((NRPN.parhi >= 0) && (NRPN.parlo >= 0))
                NRPN.vallo = value;
            break;
    }
}